

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::ungetEnterVal
          (SPxSolverBase<double> *this,SPxId enterId,Status enterStat,double leaveVal,
          SVectorBase<double> *vec,StableSum<double> *objChange)

{
  pointer pdVar1;
  DataArray<int> *pDVar2;
  int iVar3;
  VectorBase<double> *pVVar4;
  Status SVar5;
  DataKey local_48;
  double local_40;
  DataKey local_38;
  
  SVar5 = (uint)(enterStat != P_ON_UPPER) * 2 | P_ON_LOWER;
  local_48 = enterId.super_DataKey;
  local_40 = leaveVal;
  if (enterId.super_DataKey.info < 1) {
    SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_48);
    iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_38);
    (this->super_SPxBasisBase<double>).thedesc.rowstat.data[iVar3] = SVar5;
    pVVar4 = &this->theURbound;
    if (enterStat != P_ON_UPPER) {
      pVVar4 = &this->theLRbound;
    }
    StableSum<double>::operator+=
              (objChange,
               (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3] *
               (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar3]);
    pdVar1 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[iVar3] = leaveVal + pdVar1[iVar3];
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_38,(SPxId *)&local_48);
    iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_38);
    (this->super_SPxBasisBase<double>).thedesc.colstat.data[iVar3] = SVar5;
    pVVar4 = &this->theLCbound;
    if (enterStat != P_ON_UPPER) {
      pVVar4 = &this->theUCbound;
    }
    StableSum<double>::operator+=
              (objChange,
               (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3] *
               (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar3]);
    VectorBase<double>::multAdd<double,double>(this->theFrhs,&local_40,vec);
  }
  pVVar4 = &this->theTest;
  pDVar2 = &this->isInfeasibleCo;
  if (this->theRep * local_48.info < 1) {
    pVVar4 = &this->theCoTest;
    pDVar2 = &this->isInfeasible;
  }
  (pVVar4->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar3] = 0.0;
  pDVar2->data[iVar3] = 0;
  return;
}

Assistant:

void
SPxSolverBase<R>::ungetEnterVal(
   SPxId enterId,
   typename SPxBasisBase<R>::Desc::Status enterStat,
   R leaveVal,
   const SVectorBase<R>& vec,
   StableSum<R>& objChange
)
{
   assert(rep() == COLUMN);
   int enterIdx;
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   if(enterId.isSPxColId())
   {
      enterIdx = this->number(SPxColId(enterId));

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += theLCbound[enterIdx] * this->maxObj(enterIdx);
      }
      else
      {
         ds.colStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += theUCbound[enterIdx] * this->maxObj(enterIdx);
      }

      theFrhs->multAdd(leaveVal, vec);
   }
   else
   {
      enterIdx = this->number(SPxRowId(enterId));
      assert(enterId.isSPxRowId());

      if(enterStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         objChange += (theURbound[enterIdx]) * this->maxRowObj(enterIdx);
      }
      else
      {
         ds.rowStatus(enterIdx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         objChange += (theLRbound[enterIdx]) * this->maxRowObj(enterIdx);
      }

      (*theFrhs)[enterIdx] += leaveVal;
   }

   if(isId(enterId))
   {
      theTest[enterIdx] = 0;
      isInfeasibleCo[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
   else
   {
      theCoTest[enterIdx] = 0;
      isInfeasible[enterIdx] = SPxPricer<R>::NOT_VIOLATED;
   }
}